

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O1

void test_parse(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [8];
  char cVar3;
  bool bVar4;
  int iVar5;
  istream *piVar6;
  ostream *poVar7;
  long lVar8;
  char *pcVar9;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> j1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> file_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> valid;
  string line;
  ifstream f;
  undefined1 local_2c8 [8];
  undefined1 local_2c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [16];
  long local_238 [65];
  
  std::ifstream::ifstream((istream *)local_238,"test_files/general/tests.txt",_S_in);
  local_258 = local_248;
  local_250 = 0;
  local_248[0] = 0;
  paVar1 = &local_298.field_2;
  while( true ) {
    cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_258,cVar3);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::string::find_first_of((char *)&local_258,0x120522,0);
    std::__cxx11::string::substr((ulong)&local_2b8,(ulong)&local_258);
    std::__cxx11::string::substr((ulong)local_278,(ulong)&local_258);
    std::operator+(&local_298,"test_files/general/",&local_2b8);
    argo::parser::load((parser *)local_2c8,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p);
    }
    iVar5 = std::__cxx11::string::compare((char *)local_278);
    auVar2 = local_2c8;
    if (iVar5 == 0) {
      local_298._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"test_files/tmp.json","")
      ;
      argo::unparser::save((json *)auVar2,&local_298," ",""," ",0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != paVar1) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      local_298._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"test_files/tmp.json","")
      ;
      argo::parser::load((parser *)local_2c0,&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != paVar1) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      bVar4 = argo::json::operator==((json *)local_2c0,(json *)local_2c8);
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&jlog,"PASS: parse test passed, valid file ",0x24);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&jlog,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
        lVar8 = 0x28;
        pcVar9 = " was read, written, reread and compared\n";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&jlog,"FAIL: parse test failed, valid file ",0x24);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&jlog,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
        lVar8 = 0x32;
        pcVar9 = " was read, written, reread and came out different\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar9,lVar8);
      auVar2 = local_2c0;
      if (local_2c0 != (undefined1  [8])0x0) {
        argo::json::~json((json *)local_2c0);
        operator_delete((void *)auVar2);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&jlog,"FAIL: parse test failed, invalid file ",0x26);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&jlog,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," didn\'t cause an exception\n",0x1b);
    }
    auVar2 = local_2c8;
    if (local_2c8 != (undefined1  [8])0x0) {
      argo::json::~json((json *)local_2c8);
      operator_delete((void *)auVar2);
    }
    if (local_278[0] != local_268) {
      operator_delete(local_278[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p);
    }
  }
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void test_parse()
{
    ifstream f("test_files/general/tests.txt");

    string line;

    while (getline(f, line))
    {
        auto x = line.find_first_of(" ");
        auto file_name = line.substr(0, x);
        auto valid = line.substr(x + 1, line.size() - x -1);

        try
        {
            auto j = parser::load("test_files/general/" + file_name);
            if (valid == "valid")
            {
                unparser::save(*j, "test_files/tmp.json");
                auto j1 = parser::load("test_files/tmp.json");
                if (*j1 == *j)
                {
                    jlog << "PASS: parse test passed, valid file " << file_name << " was read, written, reread and compared\n";
                }
                else
                {
                    jlog << "FAIL: parse test failed, valid file " << file_name << " was read, written, reread and came out different\n";
                }
            }
            else
            {
                jlog << "FAIL: parse test failed, invalid file " << file_name << " didn't cause an exception\n";
            }
        }
        catch (exception &e)
        {
            if (valid == "valid")
            {
                jlog << "FAIL: parse test failed, valid file " << file_name << " caused an exception\n";
                jlog << e.what() << endl;
            }
            else
            {
                jlog << "PASS: parse test passed, invalid file " << file_name << " caused an exception:" << e.what() << endl;
            }
        }
    }
}